

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyDrawIndirectAttribs(DrawIndirectAttribs *Attribs)

{
  IBuffer *pIVar1;
  int iVar2;
  BIND_FLAGS BVar3;
  Char *pCVar4;
  undefined4 extraout_var;
  char (*in_RCX) [49];
  char (*in_R9) [53];
  char (*in_stack_fffffffffffffe80) [7];
  uint local_15c;
  undefined1 local_130 [8];
  string msg_6;
  Uint64 ReqCountBufSize;
  string msg_5;
  BufferDesc *CntBuffDesc;
  string msg_4;
  Uint64 ReqAttrBufSize;
  string msg_3;
  string msg_2;
  string msg_1;
  BufferDesc *AttrBuffDesc;
  undefined1 local_40 [8];
  string msg;
  IBuffer *pCounterBuffer;
  IBuffer *pAttribsBuffer;
  DrawIndirectAttribs *Attribs_local;
  char (*Args_3) [53];
  
  pIVar1 = Attribs->pAttribsBuffer;
  msg.field_2._8_8_ = Attribs->pCounterBuffer;
  if (pIVar1 == (IBuffer *)0x0) {
    FormatString<char[36],char[49]>
              ((string *)local_40,(Diligent *)"Draw indirect attribs are invalid: ",
               (char (*) [36])"indirect draw arguments buffer must not be null.",in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [49])0x76;
    DebugAssertionFailed
              (pCVar4,"VerifyDrawIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x76);
    std::__cxx11::string::~string((string *)local_40);
  }
  iVar2 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  Args_3 = (char (*) [53])CONCAT44(extraout_var,iVar2);
  BVar3 = operator&(*(BIND_FLAGS *)(*Args_3 + 0x10),BIND_INDIRECT_DRAW_ARGS);
  if (BVar3 == BIND_NONE) {
    FormatString<char[36],char[33],char_const*,char[53]>
              ((string *)((long)&msg_2.field_2 + 8),
               (Diligent *)"Draw indirect attribs are invalid: ",(char (*) [36])0x485cfc,
               (char (*) [33])Args_3,
               (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [49])0x79;
    DebugAssertionFailed
              (pCVar4,"VerifyDrawIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x79);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (1 < Attribs->DrawCount) {
    if (Attribs->DrawArgsStride < 0x10) {
      FormatString<char[36],char[37]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (Diligent *)"Draw indirect attribs are invalid: ",
                 (char (*) [36])"stride must be greater than 16 bytes",(char (*) [37])in_RCX);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [49])0x7d;
      DebugAssertionFailed
                (pCVar4,"VerifyDrawIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x7d);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    if ((Attribs->DrawArgsStride & 3) != 0) {
      FormatString<char[36],char[31]>
                ((string *)&ReqAttrBufSize,(Diligent *)"Draw indirect attribs are invalid: ",
                 (char (*) [36])"stride must be a multiple of 4",(char (*) [31])in_RCX);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"VerifyDrawIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x7e);
      std::__cxx11::string::~string((string *)&ReqAttrBufSize);
    }
  }
  if (Attribs->DrawCount < 2) {
    local_15c = 0x10;
  }
  else {
    local_15c = Attribs->DrawCount * Attribs->DrawArgsStride;
  }
  msg_4.field_2._8_8_ = Attribs->DrawArgsOffset + (ulong)local_15c;
  if (*(ulong *)(*Args_3 + 8) < (ulong)msg_4.field_2._8_8_) {
    FormatString<char[36],char[25],unsigned_long,char[38],char_const*,char[25],unsigned_long,char[7]>
              ((string *)&CntBuffDesc,(Diligent *)"Draw indirect attribs are invalid: ",
               (char (*) [36])"invalid DrawArgsOffset (",(char (*) [25])&Attribs->DrawArgsOffset,
               (unsigned_long *)") or indirect draw arguments buffer \'",(char (*) [38])Args_3,
               (char **)"\' size must be at least ",(char (*) [25])((long)&msg_4.field_2 + 8),
               (unsigned_long *)0x485e17,in_stack_fffffffffffffe80);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VerifyDrawIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x83);
    std::__cxx11::string::~string((string *)&CntBuffDesc);
    in_R9 = Args_3;
  }
  if (msg.field_2._8_8_ != 0) {
    msg_5.field_2._8_8_ = (**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
    BVar3 = operator&(*(BIND_FLAGS *)(msg_5.field_2._8_8_ + 0x10),BIND_INDIRECT_DRAW_ARGS);
    if (BVar3 == BIND_NONE) {
      FormatString<char[36],char[26],char_const*,char[53]>
                ((string *)&ReqCountBufSize,(Diligent *)"Draw indirect attribs are invalid: ",
                 (char (*) [36])"indirect counter buffer \'",(char (*) [26])msg_5.field_2._8_8_,
                 (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"VerifyDrawIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x89);
      std::__cxx11::string::~string((string *)&ReqCountBufSize);
    }
    msg_6.field_2._8_8_ = Attribs->CounterOffset + 4;
    if (*(ulong *)(msg_5.field_2._8_8_ + 8) < (ulong)msg_6.field_2._8_8_) {
      FormatString<char[36],char[24],unsigned_long,char[22],char_const*,char[25],unsigned_long,char[7]>
                ((string *)local_130,(Diligent *)"Draw indirect attribs are invalid: ",
                 (char (*) [36])"invalid CounterOffset (",(char (*) [24])&Attribs->CounterOffset,
                 (unsigned_long *)") or counter buffer \'",(char (*) [22])msg_5.field_2._8_8_,
                 (char **)"\' size must be at least ",(char (*) [25])((long)&msg_6.field_2 + 8),
                 (unsigned_long *)0x485e17,in_stack_fffffffffffffe80);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"VerifyDrawIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x8c);
      std::__cxx11::string::~string((string *)local_130);
    }
  }
  return true;
}

Assistant:

bool VerifyDrawIndirectAttribs(const DrawIndirectAttribs& Attribs)
{
    const IBuffer* pAttribsBuffer = Attribs.pAttribsBuffer;
    const IBuffer* pCounterBuffer = Attribs.pCounterBuffer;

#define CHECK_DRAW_INDIRECT_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw indirect attribs are invalid: ", __VA_ARGS__)

    CHECK_DRAW_INDIRECT_ATTRIBS(pAttribsBuffer != nullptr, "indirect draw arguments buffer must not be null.");
    const BufferDesc& AttrBuffDesc = pAttribsBuffer->GetDesc();
    CHECK_DRAW_INDIRECT_ATTRIBS((AttrBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0,
                                "indirect draw arguments buffer '", AttrBuffDesc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");

    if (Attribs.DrawCount > 1)
    {
        CHECK_DRAW_INDIRECT_ATTRIBS(Attribs.DrawArgsStride >= sizeof(Uint32) * 4, "stride must be greater than 16 bytes");
        CHECK_DRAW_INDIRECT_ATTRIBS(Attribs.DrawArgsStride % 4 == 0, "stride must be a multiple of 4");
    }

    const Uint64 ReqAttrBufSize = Attribs.DrawArgsOffset + (Attribs.DrawCount > 1 ? Attribs.DrawCount * Attribs.DrawArgsStride : Uint32{sizeof(Uint32)} * 4);
    CHECK_DRAW_INDIRECT_ATTRIBS(ReqAttrBufSize <= AttrBuffDesc.Size, "invalid DrawArgsOffset (", Attribs.DrawArgsOffset,
                                ") or indirect draw arguments buffer '", AttrBuffDesc.Name, "' size must be at least ", ReqAttrBufSize, " bytes");

    if (pCounterBuffer != nullptr)
    {
        const BufferDesc& CntBuffDesc = pCounterBuffer->GetDesc();
        CHECK_DRAW_INDIRECT_ATTRIBS((CntBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0, "indirect counter buffer '",
                                    CntBuffDesc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
        const Uint64 ReqCountBufSize = Attribs.CounterOffset + sizeof(Uint32);
        CHECK_DRAW_INDIRECT_ATTRIBS(ReqCountBufSize <= CntBuffDesc.Size, "invalid CounterOffset (", Attribs.CounterOffset,
                                    ") or counter buffer '", CntBuffDesc.Name, "' size must be at least ", ReqCountBufSize, " bytes");
    }

#undef CHECK_DRAW_INDIRECT_ATTRIBS

    return true;
}